

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linkhash.c
# Opt level: O0

unsigned_long lh_char_hash(void *k)

{
  int iVar1;
  uint32_t uVar2;
  size_t length;
  int seed;
  void *k_local;
  
  if (lh_char_hash::random_seed == -1) {
    do {
      iVar1 = json_c_get_random_seed();
    } while (iVar1 == -1);
    LOCK();
    if (lh_char_hash::random_seed != -1) {
      iVar1 = lh_char_hash::random_seed;
    }
    lh_char_hash::random_seed = iVar1;
    UNLOCK();
  }
  length = strlen((char *)k);
  uVar2 = hashlittle(k,length,lh_char_hash::random_seed);
  return (ulong)uVar2;
}

Assistant:

static unsigned long lh_char_hash(const void *k)
{
#if defined _MSC_VER || defined __MINGW32__
#define RANDOM_SEED_TYPE LONG
#else
#define RANDOM_SEED_TYPE int
#endif
	static volatile RANDOM_SEED_TYPE random_seed = -1;

	if (random_seed == -1)
	{
		RANDOM_SEED_TYPE seed;
		/* we can't use -1 as it is the uninitialized sentinel */
		while ((seed = json_c_get_random_seed()) == -1) {}
#if SIZEOF_INT == 8 && defined __GCC_HAVE_SYNC_COMPARE_AND_SWAP_8
#define USE_SYNC_COMPARE_AND_SWAP 1
#endif
#if SIZEOF_INT == 4 && defined __GCC_HAVE_SYNC_COMPARE_AND_SWAP_4
#define USE_SYNC_COMPARE_AND_SWAP 1
#endif
#if SIZEOF_INT == 2 && defined __GCC_HAVE_SYNC_COMPARE_AND_SWAP_2
#define USE_SYNC_COMPARE_AND_SWAP 1
#endif
#if defined USE_SYNC_COMPARE_AND_SWAP
		(void)__sync_val_compare_and_swap(&random_seed, -1, seed);
#elif defined _MSC_VER || defined __MINGW32__
		InterlockedCompareExchange(&random_seed, seed, -1);
#else
		//#warning "racy random seed initialization if used by multiple threads"
		random_seed = seed; /* potentially racy */
#endif
	}

	return hashlittle((const char *)k, strlen((const char *)k), (uint32_t)random_seed);
}